

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmTargetTraceDependencies::cmTargetTraceDependencies
          (cmTargetTraceDependencies *this,cmGeneratorTarget *target)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  cmLocalGenerator *pcVar4;
  cmGlobalGenerator *pcVar5;
  reference ppcVar6;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar7;
  ostream *poVar8;
  string *psVar9;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar10;
  pair<std::_Rb_tree_const_iterator<cmSourceFile_*>,_bool> pVar11;
  byte local_392;
  string local_2c0;
  undefined1 local_2a0 [8];
  ostringstream e;
  _Self local_128;
  _Self local_120;
  undefined1 local_118 [8];
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  tgts;
  cmSourceFile *sf;
  iterator __end3;
  iterator __begin3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string *c;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorTarget *target_local;
  cmTargetTraceDependencies *this_local;
  
  this->GeneratorTarget = target;
  std::queue<cmSourceFile*,std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>>::
  queue<std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>,void>
            ((queue<cmSourceFile*,std::deque<cmSourceFile*,std::allocator<cmSourceFile*>>> *)
             &this->SourceQueue);
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
            (&this->SourcesQueued);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>_>
  ::map(&this->NameMap);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->NewSources);
  pcVar3 = cmTarget::GetMakefile(target->Target);
  this->Makefile = pcVar3;
  pcVar4 = cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar4;
  pcVar5 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
  this->GlobalGenerator = pcVar5;
  this->CurrentEntry = (SourceEntry *)0x0;
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 != INTERFACE_LIBRARY) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
    cmMakefile::GetConfigurations
              ((string *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,this->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_40,true);
    std::__cxx11::string::~string
              ((string *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40);
    }
    std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
              ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
               &__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
    c = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&c), bVar1) {
      sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end2);
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range3);
      cmGeneratorTarget::GetSourceFiles
                (this->GeneratorTarget,
                 (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range3,
                 (string *)
                 sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
      __end3 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range3);
      sf = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range3);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                         *)&sf), bVar1) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&__end3);
        tgts._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppcVar6;
        psVar7 = cmGlobalGenerator::GetFilenameTargetDepends
                           (this->GlobalGenerator,
                            (cmSourceFile *)tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
               *)local_118,psVar7);
        local_120._M_node =
             (_Base_ptr)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::find((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                     *)local_118,&this->GeneratorTarget);
        local_128._M_node =
             (_Base_ptr)
             std::
             set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
             ::end((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    *)local_118);
        bVar1 = std::operator!=(&local_120,&local_128);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
          poVar8 = std::operator<<((ostream *)local_2a0,"Evaluation output file\n  \"");
          psVar9 = cmSourceFile::GetFullPath
                             ((cmSourceFile *)tgts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (string *)0x0);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          std::operator<<(poVar8,
                          "\"\ndepends on the sources of a target it is used in.  This is a dependency loop and is not allowed."
                         );
          pcVar4 = this->GeneratorTarget->LocalGenerator;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar4,FATAL_ERROR,&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          bVar1 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
        }
        else {
          pVar11 = std::
                   set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::
                   insert((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                           *)&__range2,
                          (value_type *)&tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
          local_392 = 0;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pVar11 = std::
                     set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                     ::insert(&this->SourcesQueued,
                              (value_type *)&tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
            local_392 = pVar11.second;
          }
          if ((local_392 & 1) != 0) {
            std::queue<cmSourceFile_*,_std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::push(&this->SourceQueue,
                   (value_type *)&tgts._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          bVar1 = false;
        }
        std::
        set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
        ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *)local_118);
        if (bVar1) goto LAB_004ed381;
        __gnu_cxx::
        __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&__end3);
      }
      bVar1 = false;
LAB_004ed381:
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range3);
      if (bVar1) goto LAB_004ed3d0;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar1 = false;
LAB_004ed3d0:
    std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::~set
              ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)
               &__range2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40);
    if (bVar1) {
      return;
    }
  }
  pvVar10 = cmGeneratorTarget::GetPreBuildCommands(this->GeneratorTarget);
  CheckCustomCommands(this,pvVar10);
  pvVar10 = cmGeneratorTarget::GetPreLinkCommands(this->GeneratorTarget);
  CheckCustomCommands(this,pvVar10);
  pvVar10 = cmGeneratorTarget::GetPostBuildCommands(this->GeneratorTarget);
  CheckCustomCommands(this,pvVar10);
  return;
}

Assistant:

cmTargetTraceDependencies::cmTargetTraceDependencies(cmGeneratorTarget* target)
  : GeneratorTarget(target)
{
  // Convenience.
  this->Makefile = target->Target->GetMakefile();
  this->LocalGenerator = target->GetLocalGenerator();
  this->GlobalGenerator = this->LocalGenerator->GetGlobalGenerator();
  this->CurrentEntry = nullptr;

  // Queue all the source files already specified for the target.
  if (target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    std::vector<std::string> configs;
    this->Makefile->GetConfigurations(configs);
    if (configs.empty()) {
      configs.emplace_back();
    }
    std::set<cmSourceFile*> emitted;
    for (std::string const& c : configs) {
      std::vector<cmSourceFile*> sources;
      this->GeneratorTarget->GetSourceFiles(sources, c);
      for (cmSourceFile* sf : sources) {
        const std::set<cmGeneratorTarget const*> tgts =
          this->GlobalGenerator->GetFilenameTargetDepends(sf);
        if (tgts.find(this->GeneratorTarget) != tgts.end()) {
          std::ostringstream e;
          e << "Evaluation output file\n  \"" << sf->GetFullPath()
            << "\"\ndepends on the sources of a target it is used in.  This "
               "is a dependency loop and is not allowed.";
          this->GeneratorTarget->LocalGenerator->IssueMessage(
            MessageType::FATAL_ERROR, e.str());
          return;
        }
        if (emitted.insert(sf).second &&
            this->SourcesQueued.insert(sf).second) {
          this->SourceQueue.push(sf);
        }
      }
    }
  }

  // Queue pre-build, pre-link, and post-build rule dependencies.
  this->CheckCustomCommands(this->GeneratorTarget->GetPreBuildCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPreLinkCommands());
  this->CheckCustomCommands(this->GeneratorTarget->GetPostBuildCommands());
}